

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O2

float __thiscall
deqp::gles2::Functional::VertexCubeTextureCase::calculateLod
          (VertexCubeTextureCase *this,Vec2 *texScale,Vec2 *dstSize,int textureNdx)

{
  float fVar1;
  Vec2 sizeRatio;
  Vec2 srcSize;
  Vector<float,_2> local_30;
  float local_28;
  float local_24;
  Vector<float,_2> local_20;
  
  local_20.m_data[0] = (float)(this->m_textures[textureNdx]->m_refTexture).m_size;
  local_20.m_data[1] = local_20.m_data[0];
  tcu::operator*(texScale,&local_20);
  tcu::operator/(&local_30,dstSize);
  fVar1 = deFloatLog2((float)(~-(uint)(local_24 <= local_28) & (uint)local_24 |
                             (uint)local_28 & -(uint)(local_24 <= local_28)));
  return fVar1;
}

Assistant:

float VertexCubeTextureCase::calculateLod (const Vec2& texScale, const Vec2& dstSize, int textureNdx) const
{
	const tcu::TextureCube&		refTexture	= m_textures[textureNdx]->getRefTexture();
	const Vec2					srcSize		= Vec2((float)refTexture.getSize(), (float)refTexture.getSize());
	const Vec2					sizeRatio	= texScale*srcSize / dstSize;

	// \note In this particular case, dv/dx and du/dy are zero, simplifying the expression.
	return deFloatLog2(de::max(sizeRatio.x(), sizeRatio.y()));
}